

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SyntaxList<slang::syntax::RsProdSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>,std::span<slang::syntax::RsProdSyntax*,18446744073709551615ul>>
          (BumpAllocator *this,span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *args)

{
  pointer ppRVar1;
  size_t sVar2;
  SyntaxList<slang::syntax::RsProdSyntax> *pSVar3;
  
  pSVar3 = (SyntaxList<slang::syntax::RsProdSyntax> *)allocate(this,0x38,8);
  ppRVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind = SyntaxList;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar3->super_SyntaxListBase).childCount = sVar2;
  (pSVar3->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>)._M_ptr = ppRVar1;
  (pSVar3->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>)._M_extent.
  _M_extent_value = sVar2;
  (pSVar3->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005a4060;
  return pSVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }